

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

void __thiscall
lunasvg::SVGPatternElement::SVGPatternElement(SVGPatternElement *this,Document *document)

{
  SVGPaintElement::SVGPaintElement(&this->super_SVGPaintElement,document,Pattern);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGPatternElement_001552a8;
  SVGURIReference::SVGURIReference(&this->super_SVGURIReference,(SVGElement *)this);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGPatternElement_001552a8;
  SVGFitToViewBox::SVGFitToViewBox(&this->super_SVGFitToViewBox,(SVGElement *)this);
  (this->super_SVGPaintElement).super_SVGElement.super_SVGNode._vptr_SVGNode =
       (_func_int **)&PTR__SVGPatternElement_001552a8;
  SVGLength::SVGLength(&this->m_x,X,Horizontal,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_y,Y,Vertical,Allow,0.0,None);
  SVGLength::SVGLength(&this->m_width,Width,Horizontal,Forbid,0.0,None);
  SVGLength::SVGLength(&this->m_height,Height,Vertical,Forbid,0.0,None);
  SVGTransform::SVGTransform(&this->m_patternTransform,PatternTransform);
  SVGEnumeration<lunasvg::Units>::SVGEnumeration
            (&this->m_patternUnits,PatternUnits,ObjectBoundingBox);
  SVGEnumeration<lunasvg::Units>::SVGEnumeration
            (&this->m_patternContentUnits,PatternContentUnits,UserSpaceOnUse);
  SVGElement::addProperty((SVGElement *)this,&(this->m_x).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_y).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_width).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_height).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_patternTransform).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_patternUnits).super_SVGProperty);
  SVGElement::addProperty((SVGElement *)this,&(this->m_patternContentUnits).super_SVGProperty);
  return;
}

Assistant:

SVGPatternElement::SVGPatternElement(Document* document)
    : SVGPaintElement(document, ElementID::Pattern)
    , SVGURIReference(this)
    , SVGFitToViewBox(this)
    , m_x(PropertyID::X, LengthDirection::Horizontal, LengthNegativeMode::Allow)
    , m_y(PropertyID::Y, LengthDirection::Vertical, LengthNegativeMode::Allow)
    , m_width(PropertyID::Width, LengthDirection::Horizontal, LengthNegativeMode::Forbid)
    , m_height(PropertyID::Height, LengthDirection::Vertical, LengthNegativeMode::Forbid)
    , m_patternTransform(PropertyID::PatternTransform)
    , m_patternUnits(PropertyID::PatternUnits, Units::ObjectBoundingBox)
    , m_patternContentUnits(PropertyID::PatternContentUnits, Units::UserSpaceOnUse)
{
    addProperty(m_x);
    addProperty(m_y);
    addProperty(m_width);
    addProperty(m_height);
    addProperty(m_patternTransform);
    addProperty(m_patternUnits);
    addProperty(m_patternContentUnits);
}